

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O3

string * __thiscall
project::get_source_groups_abi_cxx11_(string *__return_storage_ptr__,project *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  const_iterator pxVar4;
  const_iterator pxVar5;
  char_t *pcVar6;
  size_t sVar7;
  xml_node_struct *pxVar8;
  xml_node_struct *pxVar9;
  xpath_node node_2;
  xpath_node_set source_groups;
  xpath_node node_1;
  xpath_node_set sub_source;
  xpath_node_set sources;
  xpath_node node;
  stringstream ss;
  xpath_node local_418;
  undefined1 local_408 [96];
  xpath_node local_3a8;
  xml_node_struct *local_398 [5];
  xpath_node_set local_370;
  xpath_node local_348;
  long local_338 [14];
  ios_base local_2c8 [272];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pugi::xml_node::select_nodes
            (&local_370,(xml_node *)this,"/JUCERPROJECT/MAINGROUP/GROUP[@name = \'Source\']/FILE",
             (xpath_variable_set *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nsource_group (Source FILES\n",0x1c);
  local_408._24_8_ = __return_storage_ptr__;
  pxVar4 = pugi::xpath_node_set::begin(&local_370);
  while( true ) {
    pxVar5 = pugi::xpath_node_set::end(&local_370);
    iVar1 = (int)(ostream *)local_1a8;
    if (pxVar4 == pxVar5) break;
    local_348._node._root = (pxVar4->_node)._root;
    local_348._attribute._attr = (pxVar4->_attribute)._attr;
    local_398[0] = (xml_node_struct *)pugi::xpath_node::node(&local_348);
    local_408._56_8_ = pugi::xml_node::attribute((xml_node *)local_398,"resource");
    bVar3 = pugi::xml_attribute::as_bool((xml_attribute *)(local_408 + 0x38),false);
    if (!bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n    ",5);
      local_398[0] = (xml_node_struct *)pugi::xpath_node::node(&local_348);
      local_408._56_8_ = pugi::xml_node::attribute((xml_node *)local_398,"file");
      pcVar6 = pugi::xml_attribute::value((xml_attribute *)(local_408 + 0x38));
      if (pcVar6 == (char_t *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
      }
    }
    pxVar4 = pxVar4 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")\n",2);
  pugi::xml_node::select_nodes
            ((xpath_node_set *)(local_408 + 0x38),(xml_node *)this,
             "/JUCERPROJECT/MAINGROUP/GROUP[@name = \'Source\']/GROUP",(xpath_variable_set *)0x0);
  pxVar8 = (xml_node_struct *)pugi::xpath_node_set::begin((xpath_node_set *)(local_408 + 0x38));
  while( true ) {
    pxVar9 = (xml_node_struct *)pugi::xpath_node_set::end((xpath_node_set *)(local_408 + 0x38));
    if (pxVar8 == pxVar9) break;
    local_3a8._node._root = ((xml_node *)&pxVar8->header)->_root;
    local_3a8._attribute._attr = ((xml_attribute *)&pxVar8->name)->_attr;
    local_408._32_8_ = pxVar8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nsource_group (Source\\\\",0x17);
    local_398[0] = (xml_node_struct *)pugi::xpath_node::node(&local_3a8);
    local_348._node._root =
         (xml_node_struct *)pugi::xml_node::attribute((xml_node *)local_398,"name");
    pcVar6 = pugi::xml_attribute::value((xml_attribute *)&local_348);
    if (pcVar6 == (char_t *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," FILES\n",7);
    std::__cxx11::stringstream::stringstream((stringstream *)&local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_338,"/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = \'",0x2d);
    local_418._node = pugi::xpath_node::node(&local_3a8);
    local_398[0] = (xml_node_struct *)pugi::xml_node::attribute(&local_418._node,"name");
    pcVar6 = pugi::xml_attribute::value((xml_attribute *)local_398);
    if (pcVar6 == (char_t *)0x0) {
      std::ios::clear((int)local_338 + (int)*(undefined8 *)(local_338[0] + -0x18));
    }
    else {
      sVar7 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,pcVar6,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_338,"\']/FILE",7);
    std::__cxx11::stringbuf::str();
    pugi::xml_node::select_nodes
              ((xpath_node_set *)local_398,(xml_node *)this,(char_t *)local_418._node._root,
               (xpath_variable_set *)0x0);
    if (local_418._node._root != (xml_node_struct *)local_408) {
      operator_delete(local_418._node._root);
    }
    pxVar4 = pugi::xpath_node_set::begin((xpath_node_set *)local_398);
    while( true ) {
      pxVar5 = pugi::xpath_node_set::end((xpath_node_set *)local_398);
      if (pxVar4 == pxVar5) break;
      local_418._node._root = (pxVar4->_node)._root;
      local_418._attribute._attr = (pxVar4->_attribute)._attr;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n    ",5);
      local_408._40_8_ = pugi::xpath_node::node(&local_418);
      local_408._48_8_ = pugi::xml_node::attribute((xml_node *)(local_408 + 0x28),"file");
      pcVar6 = pugi::xml_attribute::value((xml_attribute *)(local_408 + 0x30));
      if (pcVar6 == (char_t *)0x0) {
        std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar7);
      }
      pxVar4 = pxVar4 + 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n)\n",3);
    pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)local_398);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_348);
    std::ios_base::~ios_base(local_2c8);
    pxVar8 = (xml_node_struct *)(local_408._32_8_ + 0x10);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  uVar2 = local_408._24_8_;
  std::__cxx11::stringbuf::str();
  pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)(local_408 + 0x38));
  pugi::xpath_node_set::~xpath_node_set(&local_370);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return (string *)(xml_node_struct *)uVar2;
}

Assistant:

std::string project::get_source_groups()
{
    std::stringstream ss;

    pugi::xpath_node_set sources = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/FILE");
    ss << "\nsource_group (Source FILES\n";
    for (pugi::xpath_node_set::const_iterator it = sources.begin(); it != sources.end(); ++it)
    {
        pugi::xpath_node node = *it;
        if(!node.node().attribute("resource").as_bool()) {
            ss << "\n    " << node.node().attribute("file").value();
        }
    }
    ss << "\n";
    ss << ")\n";

    pugi::xpath_node_set source_groups = m_Doc.select_nodes("/JUCERPROJECT/MAINGROUP/GROUP[@name = 'Source']/GROUP");
    for (pugi::xpath_node_set::const_iterator it = source_groups.begin(); it != source_groups.end(); ++it)
    {
        pugi::xpath_node node = *it;
        ss << "\nsource_group (Source\\\\" << node.node().attribute("name").value() << " FILES\n";

        std::stringstream q;
        q << "/JUCERPROJECT/MAINGROUP/GROUP/GROUP[@name = '" << node.node().attribute("name").value() << "']/FILE";
        pugi::xpath_node_set sub_source = m_Doc.select_nodes(q.str().c_str());
        for (pugi::xpath_node_set::const_iterator it = sub_source.begin(); it != sub_source.end(); ++it)
        {
            pugi::xpath_node node = *it;
            ss << "\n    " << node.node().attribute("file").value();
        }
        ss << "\n)\n";
    }
    ss << "\n";

    return ss.str();
}